

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlobIOSystem.h
# Opt level: O1

void __thiscall Assimp::BlobIOSystem::~BlobIOSystem(BlobIOSystem *this)

{
  pointer ppVar1;
  aiExportDataBlob *this_00;
  BlobEntry *blobby;
  pointer ppVar2;
  
  (this->super_IOSystem)._vptr_IOSystem = (_func_int **)&PTR__BlobIOSystem_0082ba48;
  ppVar1 = (this->blobs).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar2 = (this->blobs).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
    this_00 = ppVar2->second;
    if (this_00 != (aiExportDataBlob *)0x0) {
      aiExportDataBlob::~aiExportDataBlob(this_00);
      operator_delete(this_00,0x420);
    }
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>_>_>
  ::~vector(&this->blobs);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->created)._M_t);
  (this->super_IOSystem)._vptr_IOSystem = (_func_int **)&PTR__IOSystem_0082b518;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_IOSystem).m_pathStack);
  return;
}

Assistant:

virtual ~BlobIOSystem()
    {
        for(BlobEntry& blobby : blobs) {
            delete blobby.second;
        }
    }